

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Entity_State_PDU::Encode(Entity_State_PDU *this,KDataStream *stream)

{
  pointer pKVar1;
  pointer pKVar2;
  
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EntityID,stream);
  KDataStream::Write(stream,this->m_ui8ForceID);
  KDataStream::Write(stream,this->m_ui8NumOfVariableParams);
  (*(this->m_EntityType).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_EntityType,stream);
  (*(this->m_AltEntityType).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_AltEntityType,stream)
  ;
  (*(this->m_EntityLinearVelocity).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EntityLinearVelocity,stream);
  (*(this->m_EntityLocation).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EntityLocation,stream);
  (*(this->m_EntityOrientation).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EntityOrientation,stream);
  (*(this->m_EntityAppearance).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EntityAppearance,stream);
  (*(this->m_DeadReckoningParameter).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_DeadReckoningParameter,stream);
  (*(this->m_EntityMarking).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_EntityMarking,stream)
  ;
  (*(this->m_EntityCapabilities).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EntityCapabilities,stream);
  pKVar1 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar2 = (this->m_vVariableParameters).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    (*(pKVar2->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[5])(pKVar2->m_pRef,stream);
  }
  return;
}

Assistant:

void Entity_State_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );
    stream << KDIS_STREAM m_EntityID
           << m_ui8ForceID
           << m_ui8NumOfVariableParams
           << KDIS_STREAM m_EntityType
           << KDIS_STREAM m_AltEntityType
           << KDIS_STREAM m_EntityLinearVelocity
           << KDIS_STREAM m_EntityLocation
           << KDIS_STREAM m_EntityOrientation
           << KDIS_STREAM m_EntityAppearance
           << KDIS_STREAM m_DeadReckoningParameter
           << KDIS_STREAM m_EntityMarking
           << KDIS_STREAM m_EntityCapabilities;

    // Add the articulated parts
    vector<VarPrmPtr>::const_iterator citr = m_vVariableParameters.begin();
    vector<VarPrmPtr>::const_iterator citrEnd = m_vVariableParameters.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ( *citr )->Encode( stream );
    }
}